

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O2

void google::protobuf::internal::TcParser::WriteVarintToUnknown<google::protobuf::UnknownFieldSet>
               (MessageLite *msg,int number,int value)

{
  UnknownFieldSet *this;
  
  this = InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                   (&msg->_internal_metadata_);
  UnknownFieldSet::AddVarint(this,number,(long)value);
  return;
}

Assistant:

static void WriteVarintToUnknown(MessageLite* msg, int number, int value) {
    internal::WriteVarint(
        number, value,
        msg->_internal_metadata_.mutable_unknown_fields<UnknownFieldsT>());
  }